

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarTypeUtil.hpp
# Opt level: O1

bool glu::
     isValidTypePath<__gnu_cxx::__normal_iterator<glu::VarTypeComponent*,std::vector<glu::VarTypeComponent,std::allocator<glu::VarTypeComponent>>>>
               (VarType *type,
               __normal_iterator<glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
               begin,__normal_iterator<glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                     end)

{
  pointer pSVar1;
  int iVar2;
  DataType dataType;
  int iVar3;
  bool bVar4;
  
  bVar4 = begin._M_current == end._M_current;
  do {
    if (bVar4) {
LAB_01190ec9:
      return begin._M_current == end._M_current;
    }
    if ((begin._M_current)->type == ARRAY_ELEMENT) {
      if (type->m_type != TYPE_ARRAY) {
        return false;
      }
      iVar2 = (type->m_data).array.size;
      if (iVar2 != -1) {
        if ((begin._M_current)->index < 0) {
          return false;
        }
        if (iVar2 <= (begin._M_current)->index) {
          return false;
        }
      }
      type = (type->m_data).array.elementType;
    }
    else {
      if ((begin._M_current)->type != STRUCT_MEMBER) {
        if (bVar4) goto LAB_01190ec9;
        if (type->m_type == TYPE_BASIC) {
          dataType = (type->m_data).basic.type;
          if ((begin._M_current)->type == MATRIX_COLUMN) {
            if (8 < dataType - TYPE_FLOAT_MAT2 && 8 < dataType - TYPE_DOUBLE_MAT2) {
              return false;
            }
            iVar2 = getDataTypeMatrixNumRows(dataType);
            dataType = getDataTypeFloatVec(iVar2);
            begin._M_current = begin._M_current + 1;
          }
          if ((begin._M_current == end._M_current) || ((begin._M_current)->type != VECTOR_COMPONENT)
             ) goto LAB_01190ec9;
          if (((dataType < TYPE_BOOL) && ((0x77003801cU >> ((ulong)dataType & 0x3f) & 1) != 0)) ||
             (dataType - TYPE_BOOL_VEC2 < 3)) {
            getDataTypeScalarType(dataType);
            begin._M_current = begin._M_current + 1;
            goto LAB_01190ec9;
          }
        }
        return false;
      }
      if (type->m_type != TYPE_STRUCT) {
        return false;
      }
      iVar2 = (begin._M_current)->index;
      if ((long)iVar2 < 0) {
        return false;
      }
      pSVar1 = (((type->m_data).structPtr)->m_members).
               super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar3 = (int)((ulong)((long)(((type->m_data).structPtr)->m_members).
                                  super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) >> 3);
      if (SBORROW4(iVar2,iVar3 * -0x49249249) == iVar2 + iVar3 * 0x49249249 < 0) {
        return false;
      }
      type = &pSVar1[iVar2].m_type;
    }
    begin._M_current = begin._M_current + 1;
    bVar4 = begin._M_current == end._M_current;
  } while( true );
}

Assistant:

bool isValidTypePath (const VarType& type, Iterator begin, Iterator end)
{
	const VarType*	curType		= &type;
	Iterator		pathIter	= begin;

	// Process struct member and array element parts of path.
	while (pathIter != end)
	{
		if (pathIter->type == VarTypeComponent::STRUCT_MEMBER)
		{
			if (!curType->isStructType() || !de::inBounds(pathIter->index, 0, curType->getStructPtr()->getNumMembers()))
				return false;

			curType = &curType->getStructPtr()->getMember(pathIter->index).getType();
		}
		else if (pathIter->type == VarTypeComponent::ARRAY_ELEMENT)
		{
			if (!curType->isArrayType() || (curType->getArraySize() != VarType::UNSIZED_ARRAY && !de::inBounds(pathIter->index, 0, curType->getArraySize())))
				return false;

			curType = &curType->getElementType();
		}
		else
			break;

		++pathIter;
	}

	if (pathIter != end)
	{
		DE_ASSERT(pathIter->type == VarTypeComponent::MATRIX_COLUMN || pathIter->type == VarTypeComponent::VECTOR_COMPONENT);

		// Current type should be basic type.
		if (!curType->isBasicType())
			return false;

		DataType basicType = curType->getBasicType();

		if (pathIter->type == VarTypeComponent::MATRIX_COLUMN)
		{
			if (!isDataTypeMatrix(basicType))
				return false;

			basicType = getDataTypeFloatVec(getDataTypeMatrixNumRows(basicType));
			++pathIter;
		}

		if (pathIter != end && pathIter->type == VarTypeComponent::VECTOR_COMPONENT)
		{
			if (!isDataTypeVector(basicType))
				return false;

			basicType = getDataTypeScalarType(basicType);
			++pathIter;
		}
	}

	return pathIter == end;
}